

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O0

SerializedMessage *
miniros::serialization::serializeMessage<rosgraph_msgs::Log_<std::allocator<void>>>
          (Log_<std::allocator<void>_> *message)

{
  uchar *__p;
  Log_<std::allocator<void>_> *t;
  SerializedMessage *in_RDI;
  OStream s;
  uint32_t len;
  SerializedMessage *m;
  uint *in_stack_ffffffffffffff98;
  SerializedMessage *in_stack_ffffffffffffffa0;
  SerializedMessage *this;
  SerializedMessage *this_00;
  Stream local_38 [2];
  uint32_t local_18;
  undefined1 local_11;
  
  local_11 = 0;
  this = in_RDI;
  SerializedMessage::SerializedMessage(in_stack_ffffffffffffffa0);
  local_18 = serializationLength<rosgraph_msgs::Log_<std::allocator<void>>>
                       ((Log_<std::allocator<void>_> *)0x4a187f);
  this->num_bytes = (ulong)(local_18 + 4);
  this_00 = this;
  __p = (uchar *)operator_new__(this->num_bytes);
  std::__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>::reset<unsigned_char>
            ((__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2> *)this_00,__p);
  std::__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>::get
            ((__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2> *)this_00);
  OStream::OStream((OStream *)this,(uint8_t *)in_stack_ffffffffffffff98,0);
  serialize<unsigned_int,miniros::serialization::OStream>((OStream *)this,in_stack_ffffffffffffff98)
  ;
  t = (Log_<std::allocator<void>_> *)Stream::getData(local_38);
  this_00->message_start = (uint8_t *)t;
  serialize<rosgraph_msgs::Log_<std::allocator<void>>,miniros::serialization::OStream>
            ((OStream *)this,t);
  return in_RDI;
}

Assistant:

inline SerializedMessage serializeMessage(const M& message)
{
  SerializedMessage m;
  uint32_t len = serializationLength(message);
  m.num_bytes = len + 4;
  m.buf.reset(new uint8_t[m.num_bytes]);

  OStream s(m.buf.get(), static_cast<uint32_t>(m.num_bytes));
  serialize(s, static_cast<uint32_t>(m.num_bytes) - 4);
  m.message_start = s.getData();
  serialize(s, message);

  return m;
}